

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshShape.cpp
# Opt level: O2

void __thiscall
chrono::ChTriangleMeshShape::ArchiveIN(ChTriangleMeshShape *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_90;
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  ChNameValue<bool> local_60;
  ChNameValue<bool> local_48;
  ChNameValue<std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChTriangleMeshShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_30._value = &this->trimesh;
  local_30._name = "trimesh";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->wireframe;
  local_48._name = "wireframe";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->backface_cull;
  local_60._name = "backface_cull";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->name;
  local_78._name = "name";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  local_90._value = &this->scale;
  local_90._name = "scale";
  local_90._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_90);
  return;
}

Assistant:

void ChTriangleMeshShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChTriangleMeshShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(trimesh);
    marchive >> CHNVP(wireframe);
    marchive >> CHNVP(backface_cull);
    marchive >> CHNVP(name);
    marchive >> CHNVP(scale);
}